

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  FILE *__stream;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long lVar14;
  wasm_global_t *pwVar15;
  wasm_global_t *pwVar16;
  wasm_global_t *pwVar17;
  wasm_global_t *pwVar18;
  wasm_func_t *pwVar19;
  wasm_func_t *pwVar20;
  wasm_func_t *pwVar21;
  wasm_func_t *pwVar22;
  wasm_func_t *pwVar23;
  wasm_func_t *pwVar24;
  wasm_func_t *pwVar25;
  wasm_func_t *pwVar26;
  wasm_func_t *pwVar27;
  wasm_func_t *pwVar28;
  wasm_func_t *pwVar29;
  wasm_func_t *pwVar30;
  char *__s;
  wasm_val_t val33;
  wasm_val_vec_t res;
  wasm_val_t val37;
  wasm_val_t val34;
  wasm_val_t val_12;
  wasm_val_t vs73 [1];
  wasm_val_vec_t args73;
  wasm_val_vec_t args_12;
  wasm_val_vec_t results_12;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_val_t vs78 [1];
  wasm_val_t vs77 [1];
  wasm_val_t vs74 [1];
  wasm_val_t val38;
  wasm_val_t val_i64_4;
  wasm_val_t val_f32_3;
  wasm_val_t val_i64_2;
  wasm_val_t val_f32_1;
  wasm_val_vec_t args78;
  wasm_val_vec_t args77;
  wasm_val_vec_t args74;
  wasm_extern_vec_t imports;
  wasm_extern_t *externs [4];
  
  puts("Initializing...");
  uVar2 = wasm_engine_new();
  uVar3 = wasm_store_new(uVar2);
  puts("Loading binary...");
  __stream = fopen("global.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar4 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar4);
    sVar4 = fread(binary.data,sVar4,1,__stream);
    if (sVar4 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar5 = wasm_module_new(uVar3,&binary);
      if (lVar5 != 0) {
        wasm_byte_vec_delete(&binary);
        puts("Creating globals...");
        uVar6 = wasm_valtype_new(2);
        uVar6 = wasm_globaltype_new(uVar6,0);
        uVar7 = wasm_valtype_new(1);
        uVar7 = wasm_globaltype_new(uVar7,0);
        uVar8 = wasm_valtype_new(2);
        uVar8 = wasm_globaltype_new(uVar8,1);
        uVar9 = wasm_valtype_new(1);
        uVar9 = wasm_globaltype_new(uVar9,1);
        uVar10 = wasm_global_new(uVar3,uVar6);
        uVar11 = wasm_global_new(uVar3,uVar7);
        uVar12 = wasm_global_new(uVar3,uVar8);
        uVar13 = wasm_global_new(uVar3,uVar9);
        wasm_globaltype_delete(uVar6);
        wasm_globaltype_delete(uVar7);
        wasm_globaltype_delete(uVar8);
        wasm_globaltype_delete(uVar9);
        puts("Instantiating module...");
        externs[0] = (wasm_extern_t *)wasm_global_as_extern(uVar10);
        externs[1] = (wasm_extern_t *)wasm_global_as_extern(uVar11);
        externs[2] = (wasm_extern_t *)wasm_global_as_extern(uVar12);
        externs[3] = (wasm_extern_t *)wasm_global_as_extern(uVar13);
        imports.size = 4;
        imports.data = externs;
        lVar14 = wasm_instance_new(uVar3,lVar5,&imports,0);
        if (lVar14 == 0) {
          puts("> Error instantiating module!");
          return 1;
        }
        wasm_module_delete(lVar5);
        puts("Extracting exports...");
        wasm_instance_exports(lVar14);
        pwVar15 = get_export_global(&exports,0);
        pwVar16 = get_export_global(&exports,1);
        pwVar17 = get_export_global(&exports,2);
        pwVar18 = get_export_global(&exports,3);
        pwVar19 = get_export_func(&exports,4);
        pwVar20 = get_export_func(&exports,5);
        pwVar21 = get_export_func(&exports,6);
        pwVar22 = get_export_func(&exports,7);
        pwVar23 = get_export_func(&exports,8);
        pwVar24 = get_export_func(&exports,9);
        pwVar25 = get_export_func(&exports,10);
        pwVar26 = get_export_func(&exports,0xb);
        pwVar27 = get_export_func(&exports,0xc);
        pwVar28 = get_export_func(&exports,0xd);
        pwVar29 = get_export_func(&exports,0xe);
        pwVar30 = get_export_func(&exports,0xf);
        uVar6 = wasm_global_copy(uVar12);
        cVar1 = wasm_global_same(uVar12,uVar6);
        if (cVar1 != '\0') {
          wasm_global_delete(uVar6);
          puts("Accessing globals...");
          wasm_global_get(uVar10,&val33);
          if ((((float)val33.of.f32 == 1.0) && (!NAN((float)val33.of.f32))) &&
             (wasm_global_get(uVar11,&val33), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 2)) {
            wasm_global_get(uVar12,&val33);
            if ((((float)val33.of.f32 == 3.0) && (!NAN((float)val33.of.f32))) &&
               (wasm_global_get(uVar13,&val33), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 4)) {
              wasm_global_get(pwVar15,&val33);
              if ((((float)val33.of.f32 == 5.0) && (!NAN((float)val33.of.f32))) &&
                 (wasm_global_get(pwVar16,&val33), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 6))
              {
                wasm_global_get(pwVar17,&val33);
                if ((((float)val33.of.f32 == 7.0) && (!NAN((float)val33.of.f32))) &&
                   (wasm_global_get(pwVar18,&val33), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 8)
                   ) {
                  wasm_func_call(pwVar19);
                  if ((((float)val33.of.f32 == 1.0) && (!NAN((float)val33.of.f32))) &&
                     (wasm_func_call(pwVar20), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 2)) {
                    wasm_func_call(pwVar21);
                    if ((((float)val33.of.f32 == 3.0) && (!NAN((float)val33.of.f32))) &&
                       (wasm_func_call(pwVar22), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 4)) {
                      wasm_func_call(pwVar23);
                      if ((((float)val33.of.f32 == 5.0) && (!NAN((float)val33.of.f32))) &&
                         (wasm_func_call(pwVar24), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 6))
                      {
                        wasm_func_call(pwVar25);
                        if ((((float)val33.of.f32 == 7.0) && (!NAN((float)val33.of.f32))) &&
                           (wasm_func_call(pwVar26), CONCAT44(val33.of.i64._4_4_,val33.of.i32) == 8)
                           ) {
                          val33.kind = '\x02';
                          val33._1_3_ = 0;
                          val33._4_4_ = 0;
                          val33.of.i32 = 0x42040000;
                          val33.of.i64._4_4_ = 0;
                          wasm_global_set(uVar12);
                          wasm_global_set(uVar13);
                          wasm_global_set(pwVar17);
                          wasm_global_set(pwVar18);
                          wasm_global_get(uVar12,&res);
                          if (((res.data._0_4_ == 33.0) && (!NAN(res.data._0_4_))) &&
                             (wasm_global_get(uVar13,&res), res.data == (wasm_val_t *)0x22)) {
                            wasm_global_get(pwVar17,&res);
                            if ((res.data._0_4_ == 37.0) && (!NAN(res.data._0_4_))) {
                              wasm_global_get(pwVar18,(wasm_val_t *)&res);
                              if (res.data == (wasm_val_t *)0x26) {
                                vs73[0].kind = '\0';
                                vs73[0]._1_7_ = 0;
                                vs73[0].of.i64 = 0;
                                args73.size = 1;
                                args73.data = (wasm_val_t *)&res;
                                wasm_func_call(pwVar21);
                                if ((res.data._0_4_ == 33.0) && (!NAN(res.data._0_4_))) {
                                  vs73[0].kind = '\0';
                                  vs73[0]._1_7_ = 0;
                                  vs73[0].of.i64 = 0;
                                  args73.size = 1;
                                  args73.data = (wasm_val_t *)&res;
                                  wasm_func_call(pwVar22);
                                  if (res.data == (wasm_val_t *)0x22) {
                                    vs73[0].kind = '\0';
                                    vs73[0]._1_7_ = 0;
                                    vs73[0].of.i64 = 0;
                                    args73.size = 1;
                                    args73.data = (wasm_val_t *)&res;
                                    wasm_func_call(pwVar25);
                                    if ((res.data._0_4_ == 37.0) && (!NAN(res.data._0_4_))) {
                                      vs73[0].kind = '\0';
                                      vs73[0]._1_7_ = 0;
                                      vs73[0].of.i64 = 0;
                                      args73.size = 1;
                                      args73.data = (wasm_val_t *)&res;
                                      wasm_func_call(pwVar26,vs73);
                                      if (res.data == (wasm_val_t *)0x26) {
                                        res.size = 0;
                                        res.data = (wasm_val_t *)0x0;
                                        vs73[0].kind = '\x02';
                                        vs73[0]._1_7_ = 0;
                                        vs73[0].of.f64 = 5.51804386438449e-315;
                                        args73.size = 1;
                                        args73.data = vs73;
                                        wasm_func_call(pwVar27,&args73,&res);
                                        args74.data = vs74;
                                        vs74[0].kind = '\x01';
                                        vs74[0]._1_3_ = 0;
                                        vs74[0]._4_4_ = 0;
                                        vs74[0].of.i32 = 0x4a;
                                        vs74[0].of.i64._4_4_ = 0;
                                        args74.size = 1;
                                        wasm_func_call(pwVar28,&args74,&res);
                                        args77.data = vs77;
                                        vs77[0].kind = '\x02';
                                        vs77[0]._1_3_ = 0;
                                        vs77[0]._4_4_ = 0;
                                        vs77[0].of.i32 = 0x429a0000;
                                        vs77[0].of.i64._4_4_ = 0;
                                        args77.size = 1;
                                        wasm_func_call(pwVar29,&args77,&res);
                                        args78.data = vs78;
                                        vs78[0].kind = '\x01';
                                        vs78[0]._1_3_ = 0;
                                        vs78[0]._4_4_ = 0;
                                        vs78[0].of.i32 = 0x4e;
                                        vs78[0].of.i64._4_4_ = 0;
                                        args78.size = 1;
                                        wasm_func_call(pwVar30,&args78,&res);
                                        wasm_global_get(uVar12,&val_12);
                                        if ((((float)val_12.of.f32 == 73.0) &&
                                            (!NAN((float)val_12.of.f32))) &&
                                           (wasm_global_get(uVar13,&val_12),
                                           CONCAT44(val_12.of.i64._4_4_,val_12.of.i32) == 0x4a)) {
                                          wasm_global_get(pwVar17,&val_12);
                                          if ((((float)val_12.of.f32 == 77.0) &&
                                              (!NAN((float)val_12.of.f32))) &&
                                             (wasm_global_get(pwVar18,&val_12),
                                             CONCAT44(val_12.of.i64._4_4_,val_12.of.i32) == 0x4e)) {
                                            wasm_func_call(pwVar21);
                                            if ((((float)val_12.of.f32 == 73.0) &&
                                                (!NAN((float)val_12.of.f32))) &&
                                               (wasm_func_call(pwVar22),
                                               CONCAT44(val_12.of.i64._4_4_,val_12.of.i32) == 0x4a))
                                            {
                                              wasm_func_call(pwVar25);
                                              if ((((float)val_12.of.f32 == 77.0) &&
                                                  (!NAN((float)val_12.of.f32))) &&
                                                 (wasm_func_call(pwVar26),
                                                 CONCAT44(val_12.of.i64._4_4_,val_12.of.i32) == 0x4e
                                                 )) {
                                                wasm_global_delete(uVar10);
                                                wasm_global_delete(uVar11);
                                                wasm_global_delete(uVar12);
                                                wasm_global_delete(uVar13);
                                                wasm_extern_vec_delete(&exports);
                                                wasm_instance_delete(lVar14);
                                                puts("Shutting down...");
                                                wasm_store_delete(uVar3);
                                                wasm_engine_delete(uVar2);
                                                puts("Done.");
                                                return 0;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          puts("> Error reading value");
          exit(1);
        }
        __assert_fail("wasm_global_same(var_f32_import, copy)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/global.c"
                      ,0x9b,"int main(int, const char **)");
      }
      __s = "> Error compiling module!";
      goto LAB_00101fce;
    }
  }
  __s = "> Error loading module!";
LAB_00101fce:
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("global.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external globals.
  printf("Creating globals...\n");
  own wasm_globaltype_t* const_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_CONST);
  own wasm_globaltype_t* const_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_CONST);
  own wasm_globaltype_t* var_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_VAR);
  own wasm_globaltype_t* var_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_VAR);

  wasm_val_t val_f32_1 = WASM_F32_VAL(1);
  own wasm_global_t* const_f32_import =
    wasm_global_new(store, const_f32_type, &val_f32_1);
  wasm_val_t val_i64_2 = WASM_I64_VAL(2);
  own wasm_global_t* const_i64_import =
    wasm_global_new(store, const_i64_type, &val_i64_2);
  wasm_val_t val_f32_3 = WASM_F32_VAL(3);
  own wasm_global_t* var_f32_import =
    wasm_global_new(store, var_f32_type, &val_f32_3);
  wasm_val_t val_i64_4 = WASM_I64_VAL(4);
  own wasm_global_t* var_i64_import =
    wasm_global_new(store, var_i64_type, &val_i64_4);

  wasm_globaltype_delete(const_f32_type);
  wasm_globaltype_delete(const_i64_type);
  wasm_globaltype_delete(var_f32_type);
  wasm_globaltype_delete(var_i64_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = {
    wasm_global_as_extern(const_f32_import),
    wasm_global_as_extern(const_i64_import),
    wasm_global_as_extern(var_f32_import),
    wasm_global_as_extern(var_i64_import)
  };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_module_delete(module);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_global_t* const_f32_export = get_export_global(&exports, i++);
  wasm_global_t* const_i64_export = get_export_global(&exports, i++);
  wasm_global_t* var_f32_export = get_export_global(&exports, i++);
  wasm_global_t* var_i64_export = get_export_global(&exports, i++);
  wasm_func_t* get_const_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_export = get_export_func(&exports, i++);

  // Try cloning.
  own wasm_global_t* copy = wasm_global_copy(var_f32_import);
  assert(wasm_global_same(var_f32_import, copy));
  wasm_global_delete(copy);

  // Interact.
  printf("Accessing globals...\n");

  // Check initial values.
  check_global(const_f32_import, f32, 1);
  check_global(const_i64_import, i64, 2);
  check_global(var_f32_import, f32, 3);
  check_global(var_i64_import, i64, 4);
  check_global(const_f32_export, f32, 5);
  check_global(const_i64_export, i64, 6);
  check_global(var_f32_export, f32, 7);
  check_global(var_i64_export, i64, 8);

  check_call(get_const_f32_import, f32, 1);
  check_call(get_const_i64_import, i64, 2);
  check_call(get_var_f32_import, f32, 3);
  check_call(get_var_i64_import, i64, 4);
  check_call(get_const_f32_export, f32, 5);
  check_call(get_const_i64_export, i64, 6);
  check_call(get_var_f32_export, f32, 7);
  check_call(get_var_i64_export, i64, 8);

  // Modify variables through API and check again.
  wasm_val_t val33 = WASM_F32_VAL(33);
  wasm_global_set(var_f32_import, &val33);
  wasm_val_t val34 = WASM_I64_VAL(34);
  wasm_global_set(var_i64_import, &val34);
  wasm_val_t val37 = WASM_F32_VAL(37);
  wasm_global_set(var_f32_export, &val37);
  wasm_val_t val38 = WASM_I64_VAL(38);
  wasm_global_set(var_i64_export, &val38);

  check_global(var_f32_import, f32, 33);
  check_global(var_i64_import, i64, 34);
  check_global(var_f32_export, f32, 37);
  check_global(var_i64_export, i64, 38);

  check_call(get_var_f32_import, f32, 33);
  check_call(get_var_i64_import, i64, 34);
  check_call(get_var_f32_export, f32, 37);
  check_call(get_var_i64_export, i64, 38);

  // Modify variables through calls and check again.
  wasm_val_vec_t res = WASM_EMPTY_VEC;
  wasm_val_t vs73[] = { WASM_F32_VAL(73) };
  wasm_val_vec_t args73 = WASM_ARRAY_VEC(vs73);
  wasm_func_call(set_var_f32_import, &args73, &res);
  wasm_val_t vs74[] = { WASM_I64_VAL(74) };
  wasm_val_vec_t args74 = WASM_ARRAY_VEC(vs74);
  wasm_func_call(set_var_i64_import, &args74, &res);
  wasm_val_t vs77[] = { WASM_F32_VAL(77) };
  wasm_val_vec_t args77 = WASM_ARRAY_VEC(vs77);
  wasm_func_call(set_var_f32_export, &args77, &res);
  wasm_val_t vs78[] = { WASM_I64_VAL(78) };
  wasm_val_vec_t args78 = WASM_ARRAY_VEC(vs78);
  wasm_func_call(set_var_i64_export, &args78, &res);

  check_global(var_f32_import, f32, 73);
  check_global(var_i64_import, i64, 74);
  check_global(var_f32_export, f32, 77);
  check_global(var_i64_export, i64, 78);

  check_call(get_var_f32_import, f32, 73);
  check_call(get_var_i64_import, i64, 74);
  check_call(get_var_f32_export, f32, 77);
  check_call(get_var_i64_export, i64, 78);

  wasm_global_delete(const_f32_import);
  wasm_global_delete(const_i64_import);
  wasm_global_delete(var_f32_import);
  wasm_global_delete(var_i64_import);
  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}